

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

LoopEntryPointInfo * __thiscall
Js::FunctionBody::GetLoopEntryPointInfoFromNativeAddress
          (FunctionBody *this,DWORD_PTR codeAddress,uint loopNum)

{
  SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar1;
  LoopEntryPointInfo *this_00;
  code *pcVar2;
  bool bVar3;
  State SVar4;
  LoopHeader *pLVar5;
  undefined4 *puVar6;
  DWORD_PTR DVar7;
  ptrdiff_t pVar8;
  long lVar9;
  LoopEntryPointInfo *pLVar10;
  
  pLVar5 = GetLoopHeader(this,loopNum);
  if (pLVar5 == (LoopHeader *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xd26,"(loopHeader)","loopHeader");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pSVar1 = (pLVar5->entryPoints).ptr;
  if ((pSVar1 == (SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                  *)0x0) ||
     ((pSVar1->
      super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ).super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>.count < 1))
  {
    pLVar10 = (LoopEntryPointInfo *)0x0;
  }
  else {
    pLVar10 = (LoopEntryPointInfo *)0x0;
    lVar9 = 0;
    do {
      this_00 = (pSVar1->
                super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ).super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>.
                buffer.ptr[lVar9].ptr;
      if (((this_00 != (LoopEntryPointInfo *)0x0) &&
          (SVar4 = EntryPointInfo::GetState(&this_00->super_EntryPointInfo), SVar4 == CodeGenDone))
         && (DVar7 = EntryPointInfo::GetNativeAddress(&this_00->super_EntryPointInfo),
            DVar7 <= codeAddress)) {
        DVar7 = EntryPointInfo::GetNativeAddress(&this_00->super_EntryPointInfo);
        pVar8 = EntryPointInfo::GetCodeSize(&this_00->super_EntryPointInfo);
        if (codeAddress < pVar8 + DVar7) {
          pLVar10 = this_00;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (pSVar1->
                     super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     ).
                     super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>
                     .count);
  }
  return pLVar10;
}

Assistant:

LoopEntryPointInfo * FunctionBody::GetLoopEntryPointInfoFromNativeAddress(DWORD_PTR codeAddress, uint loopNum) const
    {
        LoopEntryPointInfo * entryPoint = nullptr;

        LoopHeader * loopHeader = this->GetLoopHeader(loopNum);
        Assert(loopHeader);

        loopHeader->MapEntryPoints([&](int index, LoopEntryPointInfo * currentEntryPoint)
        {
            if (currentEntryPoint->IsCodeGenDone() &&
                codeAddress >= currentEntryPoint->GetNativeAddress() &&
                codeAddress < currentEntryPoint->GetNativeAddress() + currentEntryPoint->GetCodeSize())
            {
                entryPoint = currentEntryPoint;
            }
        });

        return entryPoint;
    }